

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionCube.hpp
# Opt level: O0

void __thiscall
beagle::cpu::EigenDecompositionCube<double,_1>::~EigenDecompositionCube
          (EigenDecompositionCube<double,_1> *this)

{
  EigenDecomposition<double,_1> *in_RDI;
  int i;
  int local_c;
  
  in_RDI->_vptr_EigenDecomposition = (_func_int **)&PTR__EigenDecompositionCube_001cd4e0;
  for (local_c = 0; local_c < in_RDI->kEigenDecompCount; local_c = local_c + 1) {
    free(in_RDI[1]._vptr_EigenDecomposition[local_c]);
    free(in_RDI->gEigenValues[local_c]);
  }
  free(in_RDI[1]._vptr_EigenDecomposition);
  free(in_RDI->gEigenValues);
  free(in_RDI->matrixTmp);
  free(in_RDI->firstDerivTmp);
  free(in_RDI->secondDerivTmp);
  EigenDecomposition<double,_1>::~EigenDecomposition(in_RDI);
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>::~EigenDecompositionCube() {

	for(int i=0; i<kEigenDecompCount; i++) {
		free(gCMatrices[i]);
		free(gEigenValues[i]);
	}
	free(gCMatrices);
	free(gEigenValues);
	free(matrixTmp);
	free(firstDerivTmp);
	free(secondDerivTmp);
}